

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadUnit_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  _Elt_pointer psVar1;
  ushort uVar2;
  Logger *pLVar3;
  _Map_pointer ppsVar4;
  _Elt_pointer psVar5;
  _Elt_pointer psVar6;
  uint t;
  chunk_guard cn;
  uint local_1cc;
  long *local_1c8;
  long local_1b8 [2];
  chunk_guard local_1a8;
  undefined1 local_190 [376];
  
  if (1 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Unit");
    return;
  }
  local_1a8.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  psVar6 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar1 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_1a8.nfo = nfo;
  local_1a8.reader = reader;
  if (psVar6 != psVar1) {
    psVar5 = (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar4 = (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if ((((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_ChunkInfo).id == nfo->parent_id) {
        uVar2 = StreamReader<false,_false>::Get<short>(reader);
        local_1cc = (uint)(short)uVar2;
        if (7 < uVar2) {
          pLVar3 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<unsigned_int>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_190,&local_1cc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_190,
                     " is not a valid value for `Units` attribute in `Unit chunk` ",0x3c);
          std::ostream::_M_insert<unsigned_long>((ulong)local_190);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar3,(char *)local_1c8);
          ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          unit_scale = 1.0;
          goto LAB_004c73c8;
        }
        ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        unit_scale = units[local_1cc];
        goto LAB_004c7401;
      }
      psVar6 = psVar6 + 1;
      if (psVar6 == psVar5) {
        psVar6 = ppsVar4[1];
        ppsVar4 = ppsVar4 + 1;
        psVar5 = psVar6 + 0x20;
      }
    } while (psVar6 != psVar1);
  }
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[14]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (char (*) [14])0x6cef3e);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," is a child of ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190," which does not exist",0x15);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar3,(char *)local_1c8);
LAB_004c73c8:
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
LAB_004c7401:
  chunk_guard::~chunk_guard(&local_1a8);
  return;
}

Assistant:

void COBImporter::ReadUnit_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
     if(nfo.version > 1) {
        return UnsupportedChunk_Binary(reader,nfo,"Unit");
    }

     const chunk_guard cn(nfo,reader);

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=reader.GetI2();
            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t," is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];

            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}